

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O3

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterHyperCoDim
          (SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *feastol)

{
  uint *puVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  pointer pnVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int32_t iVar7;
  cpp_dec_float<50U,_int,_void> *pcVar8;
  int iVar9;
  int iVar10;
  int *piVar11;
  DataKey DVar12;
  fpclass_type fVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar17;
  pointer pnVar18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_28c;
  cpp_dec_float<50U,_int,_void> local_288;
  cpp_dec_float<50U,_int,_void> local_248;
  pointer local_208;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_200;
  cpp_dec_float<50U,_int,_void> *local_1f8;
  DIdxSet *local_1f0;
  cpp_dec_float<50U,_int,_void> local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  devexpr local_128 [8];
  uint auStack_120 [2];
  uint local_118 [2];
  undefined8 uStack_110;
  uint local_108 [2];
  int local_100;
  byte local_fc;
  ulong local_f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  devexpr local_68 [8];
  uint auStack_60 [2];
  uint local_58 [2];
  undefined8 uStack_50;
  uint local_48 [2];
  int local_40;
  byte local_3c;
  ulong local_38;
  
  pSVar2 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar3 = (pSVar2->theTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_208 = (pSVar2->weights).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_1f8 = &best->m_backend;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&local_1e8,-1,(type *)0x0);
  local_288.fpclass = cpp_dec_float_finite;
  local_288.prec_elem = 10;
  local_288.data._M_elems[0] = 0;
  local_288.data._M_elems[1] = 0;
  local_288.data._M_elems[2] = 0;
  local_288.data._M_elems[3] = 0;
  local_288.data._M_elems[4] = 0;
  local_288.data._M_elems[5] = 0;
  local_288.data._M_elems._24_5_ = 0;
  local_288.data._M_elems[7]._1_3_ = 0;
  local_288.data._M_elems[8] = 0;
  local_288.data._M_elems[9] = 0;
  local_288.exp = 0;
  local_288.neg = false;
  lVar15 = (long)(this->bestPricesCo).super_IdxSet.num;
  if (lVar15 < 1) {
    local_28c = -1;
  }
  else {
    local_200 = &this->last;
    uVar16 = lVar15 + 1;
    local_28c = -1;
    do {
      piVar11 = (this->bestPricesCo).super_IdxSet.idx;
      iVar10 = piVar11[uVar16 - 2];
      local_288.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar3[iVar10].m_backend.data + 0x20);
      local_288.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[iVar10].m_backend.data;
      local_288.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar3[iVar10].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar3[iVar10].m_backend.data + 0x10);
      local_288.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar4 = *(undefined8 *)(puVar1 + 2);
      local_288.data._M_elems._24_5_ = SUB85(uVar4,0);
      local_288.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_288.exp = pnVar3[iVar10].m_backend.exp;
      local_288.neg = pnVar3[iVar10].m_backend.neg;
      local_288.fpclass = pnVar3[iVar10].m_backend.fpclass;
      local_288.prec_elem = pnVar3[iVar10].m_backend.prec_elem;
      local_248.data._M_elems._32_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
      local_248.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
      local_248.data._M_elems._8_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
      local_248.data._M_elems._16_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
      local_248.data._M_elems._24_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
      local_248.exp = (feastol->m_backend).exp;
      local_248.neg = (feastol->m_backend).neg;
      local_248.fpclass = (feastol->m_backend).fpclass;
      local_248.prec_elem = (feastol->m_backend).prec_elem;
      if (local_248.data._M_elems[0] != 0 || local_248.fpclass != 0) {
        local_248.neg = (bool)(local_248.neg ^ 1);
      }
      if (local_288.fpclass == 2 || local_248.fpclass == 2) {
LAB_002bfc78:
        iVar9 = (this->bestPricesCo).super_IdxSet.num;
        (this->bestPricesCo).super_IdxSet.num = iVar9 + -1;
        piVar11[uVar16 - 2] = piVar11[(long)iVar9 + -1];
        (((this->
          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thesolver)->isInfeasibleCo).data[iVar10] = 0;
      }
      else {
        local_1f0 = (DIdxSet *)CONCAT44(local_1f0._4_4_,iVar10);
        pSVar17 = this;
        iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_288,&local_248);
        if (-1 < iVar9) {
          piVar11 = (this->bestPricesCo).super_IdxSet.idx;
          goto LAB_002bfc78;
        }
        uStack_50 = CONCAT35(local_288.data._M_elems[7]._1_3_,local_288.data._M_elems._24_5_);
        local_68 = (devexpr  [8])local_288.data._M_elems._0_8_;
        auStack_60[0] = local_288.data._M_elems[2];
        auStack_60[1] = local_288.data._M_elems[3];
        local_58[0] = local_288.data._M_elems[4];
        local_58[1] = local_288.data._M_elems[5];
        local_48[0] = local_288.data._M_elems[8];
        local_48[1] = local_288.data._M_elems[9];
        local_40 = local_288.exp;
        local_3c = local_288.neg;
        local_38._0_4_ = local_288.fpclass;
        local_38._4_4_ = local_288.prec_elem;
        local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&local_208[iVar10].m_backend.data;
        local_a8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((long)&local_208[iVar10].m_backend.data + 8);
        puVar1 = (uint *)((long)&local_208[iVar10].m_backend.data + 0x10);
        local_a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        local_a8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((long)&local_208[iVar10].m_backend.data + 0x20);
        local_a8.m_backend.exp = local_208[iVar10].m_backend.exp;
        local_a8.m_backend.neg = local_208[iVar10].m_backend.neg;
        local_a8.m_backend.fpclass = local_208[iVar10].m_backend.fpclass;
        local_a8.m_backend.prec_elem = local_208[iVar10].m_backend.prec_elem;
        local_e8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
        local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
        local_e8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
        local_e8.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
        local_e8.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
        local_e8.m_backend.exp = (feastol->m_backend).exp;
        local_e8.m_backend.neg = (feastol->m_backend).neg;
        local_e8.m_backend.fpclass = (feastol->m_backend).fpclass;
        local_e8.m_backend.prec_elem = (feastol->m_backend).prec_elem;
        devexpr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_248,local_68,&local_a8,&local_e8,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)pSVar17);
        pcVar8 = local_1f8;
        local_288.data._M_elems[8] = local_248.data._M_elems[8];
        local_288.data._M_elems[9] = local_248.data._M_elems[9];
        local_288.data._M_elems[4] = local_248.data._M_elems[4];
        local_288.data._M_elems[5] = local_248.data._M_elems[5];
        local_288.data._M_elems._24_5_ = local_248.data._M_elems._24_5_;
        local_288.data._M_elems[7]._1_3_ = local_248.data._M_elems[7]._1_3_;
        local_288.data._M_elems[0] = local_248.data._M_elems[0];
        local_288.data._M_elems[1] = local_248.data._M_elems[1];
        local_288.data._M_elems[2] = local_248.data._M_elems[2];
        local_288.data._M_elems[3] = local_248.data._M_elems[3];
        local_288.exp = local_248.exp;
        local_288.neg = local_248.neg;
        local_288.fpclass = local_248.fpclass;
        local_288.prec_elem = local_248.prec_elem;
        uVar14 = local_248._48_8_;
        if ((local_248.fpclass == 2) || (local_1f8->fpclass == cpp_dec_float_NaN)) {
LAB_002bfec3:
          fVar13 = (fpclass_type)uVar14;
        }
        else {
          iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_288,local_1f8);
          uVar14 = local_288._48_8_ & 0xffffffff;
          if (iVar9 < 1) goto LAB_002bfec3;
          pnVar18 = local_208 + iVar10;
          *(undefined8 *)((pcVar8->data)._M_elems + 8) = local_288.data._M_elems._32_8_;
          *(undefined8 *)((pcVar8->data)._M_elems + 4) = local_288.data._M_elems._16_8_;
          *(ulong *)((pcVar8->data)._M_elems + 6) =
               CONCAT35(local_288.data._M_elems[7]._1_3_,local_288.data._M_elems._24_5_);
          *(undefined8 *)(pcVar8->data)._M_elems = local_288.data._M_elems._0_8_;
          *(undefined8 *)((pcVar8->data)._M_elems + 2) = local_288.data._M_elems._8_8_;
          pcVar8->exp = local_288.exp;
          pcVar8->neg = local_288.neg;
          pcVar8->fpclass = local_288.fpclass;
          pcVar8->prec_elem = local_288.prec_elem;
          *(undefined8 *)((local_200->m_backend).data._M_elems + 8) =
               *(undefined8 *)((long)&(pnVar18->m_backend).data + 0x20);
          uVar4 = *(undefined8 *)&(pnVar18->m_backend).data;
          uVar5 = *(undefined8 *)((long)&(pnVar18->m_backend).data + 8);
          uVar6 = *(undefined8 *)((long)&(pnVar18->m_backend).data + 0x18);
          *(undefined8 *)((local_200->m_backend).data._M_elems + 4) =
               *(undefined8 *)((long)&(pnVar18->m_backend).data + 0x10);
          *(undefined8 *)((local_200->m_backend).data._M_elems + 6) = uVar6;
          *(undefined8 *)(local_200->m_backend).data._M_elems = uVar4;
          *(undefined8 *)((local_200->m_backend).data._M_elems + 2) = uVar5;
          (this->last).m_backend.exp = (pnVar18->m_backend).exp;
          (this->last).m_backend.neg = (pnVar18->m_backend).neg;
          iVar7 = (pnVar18->m_backend).prec_elem;
          (this->last).m_backend.fpclass = (pnVar18->m_backend).fpclass;
          (this->last).m_backend.prec_elem = iVar7;
          local_28c = (int)local_1f0;
          fVar13 = local_288.fpclass;
        }
        if (local_1e8.fpclass == cpp_dec_float_NaN || fVar13 == cpp_dec_float_NaN) {
LAB_002bff09:
          if (local_1e8.fpclass != cpp_dec_float_NaN) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                      (&local_248,0,(type *)0x0);
            iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_1e8,&local_248);
            if (iVar10 < 0) goto LAB_002bff32;
          }
        }
        else {
          iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_288,&local_1e8);
          if (-1 < iVar10) {
            goto LAB_002bff09;
          }
LAB_002bff32:
          local_1e8.data._M_elems[8] = local_288.data._M_elems[8];
          local_1e8.data._M_elems[9] = local_288.data._M_elems[9];
          local_1e8.data._M_elems[7]._1_3_ = local_288.data._M_elems[7]._1_3_;
          local_1e8.data._M_elems._24_5_ = local_288.data._M_elems._24_5_;
          local_1e8.data._M_elems[4] = local_288.data._M_elems[4];
          local_1e8.data._M_elems[5] = local_288.data._M_elems[5];
          local_1e8.data._M_elems[0] = local_288.data._M_elems[0];
          local_1e8.data._M_elems[1] = local_288.data._M_elems[1];
          local_1e8.data._M_elems[2] = local_288.data._M_elems[2];
          local_1e8.data._M_elems[3] = local_288.data._M_elems[3];
          local_1e8.exp = local_288.exp;
          local_1e8.neg = local_288.neg;
          local_1e8.fpclass = local_288.fpclass;
          local_1e8.prec_elem = local_288.prec_elem;
        }
      }
      uVar16 = uVar16 - 1;
    } while (1 < uVar16);
  }
  lVar15 = (long)(((this->
                   super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver)->updateViolsCo).super_IdxSet.num;
  if (0 < lVar15) {
    local_1f0 = &this->bestPricesCo;
    local_200 = &this->last;
    uVar16 = lVar15 + 1;
    do {
      pSVar2 = (this->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      piVar11 = (pSVar2->isInfeasibleCo).data;
      iVar10 = (pSVar2->updateViolsCo).super_IdxSet.idx[uVar16 - 2];
      if (piVar11[iVar10] == 1) {
        local_288.data._M_elems._32_8_ =
             *(undefined8 *)((long)&pnVar3[iVar10].m_backend.data + 0x20);
        local_288.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[iVar10].m_backend.data;
        local_288.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar3[iVar10].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar3[iVar10].m_backend.data + 0x10);
        local_288.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        uVar4 = *(undefined8 *)(puVar1 + 2);
        local_288.data._M_elems._24_5_ = SUB85(uVar4,0);
        local_288.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_288.exp = pnVar3[iVar10].m_backend.exp;
        local_288.neg = pnVar3[iVar10].m_backend.neg;
        local_288.fpclass = pnVar3[iVar10].m_backend.fpclass;
        local_288.prec_elem = pnVar3[iVar10].m_backend.prec_elem;
        local_248.data._M_elems._32_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
        local_248.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
        local_248.data._M_elems._8_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
        local_248.data._M_elems._16_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
        local_248.data._M_elems._24_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
        local_248.exp = (feastol->m_backend).exp;
        local_248.neg = (feastol->m_backend).neg;
        local_248.fpclass = (feastol->m_backend).fpclass;
        local_248.prec_elem = (feastol->m_backend).prec_elem;
        if (local_248.data._M_elems[0] != 0 || local_248.fpclass != 0) {
          local_248.neg = (bool)(local_248.neg ^ 1);
        }
        if (local_288.fpclass != 2 && local_248.fpclass != 2) {
          pSVar17 = this;
          iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_288,&local_248);
          if (iVar9 < 0) {
            uStack_110 = CONCAT35(local_288.data._M_elems[7]._1_3_,local_288.data._M_elems._24_5_);
            local_128 = (devexpr  [8])local_288.data._M_elems._0_8_;
            auStack_120[0] = local_288.data._M_elems[2];
            auStack_120[1] = local_288.data._M_elems[3];
            local_118[0] = local_288.data._M_elems[4];
            local_118[1] = local_288.data._M_elems[5];
            local_108[0] = local_288.data._M_elems[8];
            local_108[1] = local_288.data._M_elems[9];
            local_100 = local_288.exp;
            local_fc = local_288.neg;
            local_f8._0_4_ = local_288.fpclass;
            local_f8._4_4_ = local_288.prec_elem;
            local_168.m_backend.data._M_elems._0_8_ =
                 *(undefined8 *)&local_208[iVar10].m_backend.data;
            local_168.m_backend.data._M_elems._8_8_ =
                 *(undefined8 *)((long)&local_208[iVar10].m_backend.data + 8);
            puVar1 = (uint *)((long)&local_208[iVar10].m_backend.data + 0x10);
            local_168.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
            local_168.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
            local_168.m_backend.data._M_elems._32_8_ =
                 *(undefined8 *)((long)&local_208[iVar10].m_backend.data + 0x20);
            local_168.m_backend.exp = local_208[iVar10].m_backend.exp;
            local_168.m_backend.neg = local_208[iVar10].m_backend.neg;
            local_168.m_backend.fpclass = local_208[iVar10].m_backend.fpclass;
            local_168.m_backend.prec_elem = local_208[iVar10].m_backend.prec_elem;
            local_1a8.m_backend.data._M_elems._32_8_ =
                 *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
            local_1a8.m_backend.data._M_elems._0_8_ =
                 *(undefined8 *)(feastol->m_backend).data._M_elems;
            local_1a8.m_backend.data._M_elems._8_8_ =
                 *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
            local_1a8.m_backend.data._M_elems._16_8_ =
                 *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
            local_1a8.m_backend.data._M_elems._24_8_ =
                 *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
            local_1a8.m_backend.exp = (feastol->m_backend).exp;
            local_1a8.m_backend.neg = (feastol->m_backend).neg;
            local_1a8.m_backend.fpclass = (feastol->m_backend).fpclass;
            local_1a8.m_backend.prec_elem = (feastol->m_backend).prec_elem;
            devexpr::
            computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_248,local_128,&local_168,&local_1a8,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)pSVar17);
            local_288.data._M_elems[8] = local_248.data._M_elems[8];
            local_288.data._M_elems[9] = local_248.data._M_elems[9];
            local_288.data._M_elems[4] = local_248.data._M_elems[4];
            local_288.data._M_elems[5] = local_248.data._M_elems[5];
            local_288.data._M_elems._24_5_ = local_248.data._M_elems._24_5_;
            local_288.data._M_elems[7]._1_3_ = local_248.data._M_elems[7]._1_3_;
            local_288.data._M_elems[0] = local_248.data._M_elems[0];
            local_288.data._M_elems[1] = local_248.data._M_elems[1];
            local_288.data._M_elems[2] = local_248.data._M_elems[2];
            local_288.data._M_elems[3] = local_248.data._M_elems[3];
            local_288.exp = local_248.exp;
            local_288.neg = local_248.neg;
            local_288.fpclass = local_248.fpclass;
            local_288.prec_elem = local_248.prec_elem;
            if (((local_248.fpclass != 2) && (local_1e8.fpclass != cpp_dec_float_NaN)) &&
               (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_288,&local_1e8), 0 < iVar9)) {
              if (((local_288.fpclass != cpp_dec_float_NaN) &&
                  (local_1f8->fpclass != cpp_dec_float_NaN)) &&
                 (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    (&local_288,local_1f8), 0 < iVar9)) {
                pnVar18 = local_208 + iVar10;
                *(undefined8 *)
                 ((((cpp_dec_float<50U,_int,_void> *)&local_1f8->data)->data)._M_elems + 8) =
                     local_288.data._M_elems._32_8_;
                *(undefined8 *)
                 ((((cpp_dec_float<50U,_int,_void> *)&local_1f8->data)->data)._M_elems + 4) =
                     local_288.data._M_elems._16_8_;
                *(ulong *)((((cpp_dec_float<50U,_int,_void> *)&local_1f8->data)->data)._M_elems + 6)
                     = CONCAT35(local_288.data._M_elems[7]._1_3_,local_288.data._M_elems._24_5_);
                *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&local_1f8->data)->data)._M_elems
                     = local_288.data._M_elems._0_8_;
                *(undefined8 *)
                 ((((cpp_dec_float<50U,_int,_void> *)&local_1f8->data)->data)._M_elems + 2) =
                     local_288.data._M_elems._8_8_;
                local_1f8->exp = local_288.exp;
                local_1f8->neg = local_288.neg;
                local_1f8->fpclass = local_288.fpclass;
                local_1f8->prec_elem = local_288.prec_elem;
                *(undefined8 *)((local_200->m_backend).data._M_elems + 8) =
                     *(undefined8 *)((long)&(pnVar18->m_backend).data + 0x20);
                uVar4 = *(undefined8 *)&(pnVar18->m_backend).data;
                uVar5 = *(undefined8 *)((long)&(pnVar18->m_backend).data + 8);
                uVar6 = *(undefined8 *)((long)&(pnVar18->m_backend).data + 0x18);
                *(undefined8 *)((local_200->m_backend).data._M_elems + 4) =
                     *(undefined8 *)((long)&(pnVar18->m_backend).data + 0x10);
                *(undefined8 *)((local_200->m_backend).data._M_elems + 6) = uVar6;
                *(undefined8 *)(local_200->m_backend).data._M_elems = uVar4;
                *(undefined8 *)((local_200->m_backend).data._M_elems + 2) = uVar5;
                (this->last).m_backend.exp = (pnVar18->m_backend).exp;
                (this->last).m_backend.neg = (pnVar18->m_backend).neg;
                iVar7 = (pnVar18->m_backend).prec_elem;
                (this->last).m_backend.fpclass = (pnVar18->m_backend).fpclass;
                (this->last).m_backend.prec_elem = iVar7;
                local_28c = iVar10;
              }
              (((this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver)->isInfeasibleCo).data[iVar10] = 2;
              DIdxSet::addIdx(local_1f0,iVar10);
            }
            goto LAB_002c00ba;
          }
          piVar11 = (((this->
                      super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thesolver)->isInfeasibleCo).data;
        }
        piVar11[iVar10] = 0;
      }
LAB_002c00ba:
      uVar16 = uVar16 - 1;
    } while (1 < uVar16);
  }
  if (local_28c < 0) {
    DVar12.info = 0;
    DVar12.idx = -1;
  }
  else {
    DVar12 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::id((this->
                           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).thesolver,local_28c);
  }
  return (SPxId)DVar12;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterHyperCoDim(R& best, R feastol)
{
   const R* test = this->thesolver->test().get_const_ptr();
   const R* pen = this->thesolver->weights.get_const_ptr();
   R leastBest = -1;
   R x;
   int enterIdx = -1;
   int idx;

   // find the best price from short candidate list
   for(int i = bestPricesCo.size() - 1; i >= 0; --i)
   {
      idx = bestPricesCo.index(i);
      x = test[idx];

      if(x < -feastol)
      {
         x = devexpr::computePrice(x, pen[idx], feastol);

         assert(x >= 0);

         // update the best price of candidate list
         if(x > best)
         {
            best = x;
            enterIdx = idx;
            last = pen[idx];
         }

         // update the smallest price of candidate list
         if(x < leastBest || leastBest < 0)
            leastBest = x;
      }
      else
      {
         bestPricesCo.remove(i);
         this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
      }
   }

   //scan the updated indeces for a better price
   for(int i = this->thesolver->updateViolsCo.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->updateViolsCo.index(i);

      // only look at indeces that were not checked already
      if(this->thesolver->isInfeasibleCo[idx] == this->VIOLATED)
      {
         x = test[idx];

         if(x < -feastol)
         {
            x = devexpr::computePrice(x, pen[idx], feastol);

            if(x > leastBest)
            {
               if(x > best)
               {
                  best = x;
                  enterIdx = idx;
                  last = pen[idx];
               }

               // put index into candidate list
               this->thesolver->isInfeasibleCo[idx] = this->VIOLATED_AND_CHECKED;
               bestPricesCo.addIdx(idx);
            }
         }
         else
         {
            this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
         }
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->id(enterIdx);
   else
      return SPxId();
}